

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O3

handle pybind11::detail::
       eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
                 (Type *src,handle base,bool writeable)

{
  array aVar1;
  array a;
  allocator_type local_79;
  array local_78;
  array local_70;
  long local_68 [2];
  StridesContainer local_58;
  ShapeContainer local_40;
  Index local_28;
  Index IStack_20;
  
  array::array(&local_78);
  local_28 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_rows;
  IStack_20 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
              m_cols;
  std::vector<long,std::allocator<long>>::vector<long_const*,void>
            ((vector<long,std::allocator<long>> *)&local_40,&local_28,
             (long *)&stack0xffffffffffffffe8,(allocator_type *)local_68);
  local_68[0] = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_cols << 3;
  local_68[1] = 8;
  std::vector<long,std::allocator<long>>::vector<long_const*,void>
            ((vector<long,std::allocator<long>> *)&local_58,local_68,(long *)&local_58,&local_79);
  array::array<double>
            (&local_70,&local_40,&local_58,
             (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_data,base);
  object::operator=((object *)&local_78,(object *)&local_70);
  object::~object((object *)&local_70);
  if (local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  aVar1.super_buffer.super_object.super_handle.m_ptr =
       local_78.super_buffer.super_object.super_handle.m_ptr;
  if (!writeable) {
    *(byte *)((long)local_78.super_buffer.super_object.super_handle.m_ptr + 0x41) =
         *(byte *)((long)local_78.super_buffer.super_object.super_handle.m_ptr + 0x41) & 0xfb;
  }
  local_78.super_buffer.super_object.super_handle.m_ptr = (buffer)(object)0x0;
  object::~object((object *)&local_78);
  return (handle)(PyObject *)aVar1.super_buffer.super_object.super_handle.m_ptr;
}

Assistant:

handle eigen_array_cast(typename props::Type const &src, handle base = handle(), bool writeable = true) {
    constexpr ssize_t elem_size = sizeof(typename props::Scalar);
    array a;
    if (props::vector)
        a = array({ src.size() }, { elem_size * src.innerStride() }, src.data(), base);
    else
        a = array({ src.rows(), src.cols() }, { elem_size * src.rowStride(), elem_size * src.colStride() },
                  src.data(), base);

    if (!writeable)
        array_proxy(a.ptr())->flags &= ~detail::npy_api::NPY_ARRAY_WRITEABLE_;

    return a.release();
}